

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

ostream * Catch::operator<<(ostream *_stream,Text *_text)

{
  bool bVar1;
  reference pbVar2;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_30;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_28;
  const_iterator itEnd;
  const_iterator it;
  Text *_text_local;
  ostream *_stream_local;
  
  itEnd = Text::begin_abi_cxx11_(_text);
  local_28._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       Text::end_abi_cxx11_(_text);
  while (bVar1 = __gnu_cxx::operator!=(&itEnd,&local_28), bVar1) {
    local_30._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         Text::begin_abi_cxx11_(_text);
    bVar1 = __gnu_cxx::operator!=(&itEnd,&local_30);
    if (bVar1) {
      std::operator<<(_stream,"\n");
    }
    pbVar2 = __gnu_cxx::
             __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&itEnd);
    std::operator<<(_stream,(string *)pbVar2);
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&itEnd);
  }
  return _stream;
}

Assistant:

std::ostream& operator << ( std::ostream& _stream, Text const& _text ) {
        for( Text::const_iterator it = _text.begin(), itEnd = _text.end();
            it != itEnd; ++it ) {
            if( it != _text.begin() )
                _stream << "\n";
            _stream << *it;
        }
        return _stream;
    }